

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSNode.h
# Opt level: O0

bool __thiscall dg::pta::PSNodeRet::addReturnSite(PSNodeRet *this,PSNode *r)

{
  bool bVar1;
  iterator this_00;
  reference ppPVar2;
  PSNode *in_RSI;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  *in_RDI;
  PSNode *p;
  iterator __end2;
  iterator __begin2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffffb8;
  PSNode *in_stack_ffffffffffffffc8;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_28;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  *local_20;
  PSNode *local_18;
  
  local_20 = in_RDI + 0x1d;
  local_18 = in_RSI;
  local_28._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  this_00 = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                      (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)this_00._M_current
                 ,(value_type *)in_stack_ffffffffffffffc8);
      return true;
    }
    ppPVar2 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_28);
    in_stack_ffffffffffffffc8 = *ppPVar2;
    if (in_stack_ffffffffffffffc8 == local_18) break;
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_28);
  }
  return false;
}

Assistant:

bool addReturnSite(PSNode *r) {
        // we suppose there are just few callees,
        // so this should be faster than std::set
        for (PSNode *p : returns) {
            if (p == r)
                return false;
        }

        returns.push_back(r);
        return true;
    }